

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true> *this,AddressEntry *Elt)

{
  uint64_t *puVar1;
  uint uVar2;
  void *pvVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
      super_SmallVectorBase.Size) {
    SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,true>::push_back(this);
  }
  pvVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
           super_SmallVectorBase.BeginX;
  uVar5 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
                 super_SmallVectorBase.Size;
  *(undefined8 *)((long)pvVar3 + uVar5 * 0x18 + 0x10) = *(undefined8 *)&Elt->CuIndex;
  uVar4 = Elt->HighAddress;
  puVar1 = (uint64_t *)((long)pvVar3 + uVar5 * 0x18);
  *puVar1 = Elt->LowAddress;
  puVar1[1] = uVar4;
  uVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
          super_SmallVectorBase.Size;
  if (uVar2 < (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
    super_SmallVectorBase.Size = uVar2 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }